

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook_test.cc
# Opt level: O0

void __thiscall HookListTest_AddAppends_Test::TestBody(HookListTest_AddAppends_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_160;
  Message local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_3;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  Message local_118;
  int local_110 [2];
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  NewHook values [2];
  AssertHelper local_e0;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  string local_b0;
  AssertHelper local_90;
  Message local_88 [3];
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  TestHookList list;
  HookListTest_AddAppends_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x1;
  local_69 = ::base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::Add
                       ((HookList<void_(*)(const_void_*,_unsigned_long)> *)&gtest_ar_.message_,
                        anon_class_1_0_00000001::__invoke);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_68,(AssertionResult *)"list.Add(kAnotherTestValue)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/malloc_hook_test.cc"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(local_88);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_cc = 2;
    testing::internal::EqHelper::Compare<int,_std::atomic<unsigned_long>,_nullptr>
              ((EqHelper *)local_c8,"2","list.priv_end",&local_cc,
               (atomic<unsigned_long> *)&gtest_ar_.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/malloc_hook_test.cc"
                 ,0x5c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::Message::~Message(&local_d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    values[0] = (NewHook)0x0;
    local_110[1] = 2;
    local_110[0] = ::base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::Traverse
                             ((HookList<void_(*)(const_void_*,_unsigned_long)> *)&gtest_ar_.message_
                              ,(_func_void_void_ptr_unsigned_long **)&gtest_ar_1.message_,2);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_108,"2","list.Traverse(values, 2)",local_110 + 1,local_110);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/malloc_hook_test.cc"
                 ,0x5f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    testing::internal::EqHelper::
    Compare<void_(*)(const_void_*,_unsigned_long),_void_(*)(const_void_*,_unsigned_long),_nullptr>
              ((EqHelper *)local_130,"kTestValue","values[0]",
               (_func_void_void_ptr_unsigned_long **)&kTestValue,
               (_func_void_void_ptr_unsigned_long **)&gtest_ar_1.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/malloc_hook_test.cc"
                 ,0x60,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_138);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_138);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    testing::internal::EqHelper::
    Compare<void_(*)(const_void_*,_unsigned_long),_void_(*)(const_void_*,_unsigned_long),_nullptr>
              ((EqHelper *)local_150,"kAnotherTestValue","values[1]",
               (_func_void_void_ptr_unsigned_long **)&kAnotherTestValue,
               (_func_void_void_ptr_unsigned_long **)values);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
      testing::internal::AssertHelper::AssertHelper
                (&local_160,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/malloc_hook_test.cc"
                 ,0x61,pcVar2);
      testing::internal::AssertHelper::operator=(&local_160,&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_160);
      testing::Message::~Message(&local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  }
  return;
}

Assistant:

TEST(HookListTest, AddAppends) {
  TestHookList list{kTestValue};
  ASSERT_TRUE(list.Add(kAnotherTestValue));
  EXPECT_EQ(2, list.priv_end);

  MallocHook::NewHook values[2] = {};
  EXPECT_EQ(2, list.Traverse(values, 2));
  EXPECT_EQ(kTestValue, values[0]);
  EXPECT_EQ(kAnotherTestValue, values[1]);
}